

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

iterator * __thiscall Catch::TextFlow::Columns::iterator::operator++(iterator *this)

{
  pointer pCVar1;
  pointer pcVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  lVar3 = 0;
  for (uVar4 = 0;
      pCVar1 = (this->m_columns->
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->m_columns->
                             super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x38);
      uVar4 = uVar4 + 1) {
    pcVar2 = (this->m_iterators).
             super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((*(long *)((long)&pcVar2->m_lineStart + lVar5) !=
         *(long *)((long)&(pCVar1->m_string)._M_string_length + lVar3)) ||
       ((long)&(pCVar1->m_string)._M_dataplus + lVar3 != *(long *)((long)&pcVar2->m_column + lVar5))
       ) {
      Column::const_iterator::operator++((const_iterator *)((long)&pcVar2->m_column + lVar5));
    }
    lVar3 = lVar3 + 0x38;
    lVar5 = lVar5 + 0x28;
  }
  return this;
}

Assistant:

Columns::iterator& Columns::iterator::operator++() {
            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                if ( m_iterators[i] != m_columns[i].end() ) {
                    ++m_iterators[i];
                }
            }
            return *this;
        }